

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O2

LY_ERR lysp_stmt_type_enum(lysp_ctx *ctx,lysp_stmt *stmt,lysp_type_enum **enums)

{
  uint16_t *flags;
  lysp_ext_instance **exts;
  lysp_stmt *stmt_00;
  lyd_node *plVar1;
  char **ppcVar2;
  LY_ERR LVar3;
  int iVar4;
  LY_ERR LVar5;
  long *plVar6;
  long lVar7;
  size_t name_len;
  char *pcVar8;
  char *pcVar9;
  char *format;
  uint32_t substmt_index;
  ly_stmt stmt_01;
  ly_ctx *plVar10;
  lysp_ext_instance **in_R8;
  lysp_ext_instance **in_R9;
  lysp_type_enum *plVar11;
  lysp_stmt **pplVar12;
  long lVar13;
  
  LVar3 = lysp_stmt_validate_value(ctx,(uint)(stmt->kw == LY_STMT_ENUM) * 2,stmt->arg);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  plVar11 = *enums;
  if (plVar11 == (lysp_type_enum *)0x0) {
    plVar6 = (long *)malloc(0x40);
    if (plVar6 == (long *)0x0) goto LAB_00167403;
    *plVar6 = 1;
    lVar7 = 1;
  }
  else {
    lVar7 = *(long *)&plVar11[-1].flags;
    *(long *)&plVar11[-1].flags = lVar7 + 1;
    plVar6 = (long *)realloc(&plVar11[-1].flags,lVar7 * 0x38 + 0x40);
    if (plVar6 == (long *)0x0) {
      *(long *)&(*enums)[-1].flags = *(long *)&(*enums)[-1].flags + -1;
LAB_00167403:
      if (ctx == (lysp_ctx *)0x0) {
        plVar10 = (ly_ctx *)0x0;
      }
      else {
        plVar10 = (ly_ctx *)
                  **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(plVar10,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_type_enum");
      return LY_EMEM;
    }
    lVar7 = *plVar6;
  }
  *enums = (lysp_type_enum *)(plVar6 + 1);
  plVar6[lVar7 * 7 + -2] = 0;
  (plVar6 + lVar7 * 7 + -2)[1] = 0;
  plVar6[lVar7 * 7] = 0;
  plVar6[lVar7 * 7 + -4] = 0;
  (plVar6 + lVar7 * 7 + -4)[1] = 0;
  plVar6[lVar7 * 7 + -6] = 0;
  (plVar6 + lVar7 * 7 + -6)[1] = 0;
  if (stmt->kw == LY_STMT_ENUM) {
    pcVar9 = stmt->arg;
    name_len = strlen(pcVar9);
    LVar3 = lysp_check_enum_name(ctx,pcVar9,name_len);
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
  }
  if (ctx == (lysp_ctx *)0x0) {
    plVar10 = (ly_ctx *)0x0;
  }
  else {
    plVar10 = (ly_ctx *)
              **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  LVar3 = lydict_insert(plVar10,stmt->arg,0,(char **)(plVar6 + lVar7 * 7 + -6));
  if (LVar3 == LY_SUCCESS) {
    plVar11 = *enums;
    if (plVar11 == (lysp_type_enum *)0x0) {
LAB_001674bb:
      flags = (uint16_t *)(plVar6 + lVar7 * 7);
      exts = (lysp_ext_instance **)(flags + -4);
      LVar3 = LY_SUCCESS;
      pplVar12 = &stmt->child;
      while (stmt_00 = *pplVar12, stmt_00 != (lysp_stmt *)0x0) {
        stmt_01 = stmt_00->kw;
        if (stmt_01 == LY_STMT_VALUE) {
          if (stmt->kw == LY_STMT_BIT) {
            if (ctx == (lysp_ctx *)0x0) {
              plVar10 = (ly_ctx *)0x0;
            }
            else {
              plVar10 = (ly_ctx *)
                        **(undefined8 **)
                          (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            stmt_01 = LY_STMT_VALUE;
            goto LAB_001676de;
          }
LAB_001675ed:
          in_R8 = exts;
          LVar5 = lysp_stmt_type_enum_value_pos(ctx,stmt_00,(int64_t *)(flags + -0xc),flags,exts);
        }
        else if (stmt_01 == LY_STMT_EXTENSION_INSTANCE) {
          in_R8 = exts;
          LVar5 = lysp_stmt_ext(ctx,stmt_00,stmt->kw,0,exts);
        }
        else if (stmt_01 == LY_STMT_IF_FEATURE) {
          plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          if (*(byte *)&plVar1[2].schema < 2) {
            plVar10 = (ly_ctx *)**(undefined8 **)plVar1;
            pcVar8 = lyplg_ext_stmt2str(stmt->kw);
            format = 
            "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
            ;
            pcVar9 = "if-feature";
            goto LAB_00167705;
          }
          LVar5 = lysp_stmt_qnames(ctx,stmt_00,(lysp_qname **)(flags + -8),(yang_arg)exts,in_R8);
        }
        else {
          if (stmt_01 == LY_STMT_POSITION) {
            if (stmt->kw != LY_STMT_ENUM) goto LAB_001675ed;
            if (ctx == (lysp_ctx *)0x0) {
              plVar10 = (ly_ctx *)0x0;
            }
            else {
              plVar10 = (ly_ctx *)
                        **(undefined8 **)
                          (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            stmt_01 = LY_STMT_POSITION;
LAB_001676de:
            pcVar9 = lyplg_ext_stmt2str(stmt_01);
            pcVar8 = lyplg_ext_stmt2str(stmt->kw);
            format = "Invalid keyword \"%s\" as a child of \"%s\".";
            goto LAB_00167705;
          }
          substmt_index = (int)flags - 0x20;
          if (stmt_01 != LY_STMT_REFERENCE) {
            if (stmt_01 == LY_STMT_STATUS) {
              LVar5 = lysp_stmt_status(ctx,stmt_00,flags,exts);
              goto LAB_00167604;
            }
            substmt_index = (int)flags - 0x28;
            if (stmt_01 != LY_STMT_DESCRIPTION) {
              if (ctx == (lysp_ctx *)0x0) {
                plVar10 = (ly_ctx *)0x0;
              }
              else {
                plVar10 = (ly_ctx *)
                          **(undefined8 **)
                            (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              goto LAB_001676de;
            }
          }
          in_R8 = exts;
          LVar5 = lysp_stmt_text_field(ctx,stmt_00,substmt_index,(char **)0x2,(yang_arg)exts,in_R9);
        }
LAB_00167604:
        if (LVar5 != LY_SUCCESS) {
          return LVar5;
        }
        pplVar12 = &stmt_00->next;
      }
    }
    else {
      lVar13 = *(long *)&plVar11[-1].flags;
      do {
        lVar13 = lVar13 + -1;
        if (lVar13 == 0) goto LAB_001674bb;
        ppcVar2 = &plVar11->name;
        plVar11 = plVar11 + 1;
        pcVar9 = (char *)plVar6[lVar7 * 7 + -6];
        iVar4 = strcmp(*ppcVar2,pcVar9);
      } while (iVar4 != 0);
      if (ctx == (lysp_ctx *)0x0) {
        plVar10 = (ly_ctx *)0x0;
      }
      else {
        plVar10 = (ly_ctx *)
                  **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar8 = lyplg_ext_stmt2str(stmt->kw);
      format = "Duplicate identifier \"%s\" of %s statement.";
LAB_00167705:
      ly_vlog(plVar10,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar9,pcVar8);
      LVar3 = LY_EVALID;
    }
  }
  return LVar3;
}

Assistant:

static LY_ERR
lysp_stmt_type_enum(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_type_enum **enums)
{
    struct lysp_type_enum *enm;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, stmt->kw == LY_STMT_ENUM ? Y_STR_ARG : Y_IDENTIF_ARG, stmt->arg));

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *enums, enm, LY_EMEM);

    if (stmt->kw == LY_STMT_ENUM) {
        LY_CHECK_RET(lysp_check_enum_name(ctx, stmt->arg, strlen(stmt->arg)));
    } /* else nothing specific for YANG_BIT */

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &enm->name));
    CHECK_UNIQUENESS(ctx, *enums, name, lyplg_ext_stmt2str(stmt->kw), enm->name);

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &enm->dsc, Y_STR_ARG, &enm->exts));
            break;
        case LY_STMT_IF_FEATURE:
            PARSER_CHECK_STMTVER2_RET(ctx, "if-feature", lyplg_ext_stmt2str(stmt->kw));
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &enm->iffeatures, Y_STR_ARG, &enm->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &enm->ref, Y_STR_ARG, &enm->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &enm->flags, &enm->exts));
            break;
        case LY_STMT_VALUE:
            LY_CHECK_ERR_RET(stmt->kw == LY_STMT_BIT, LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw),
                    lyplg_ext_stmt2str(stmt->kw)), LY_EVALID);
            LY_CHECK_RET(lysp_stmt_type_enum_value_pos(ctx, child, &enm->value, &enm->flags, &enm->exts));
            break;
        case LY_STMT_POSITION:
            LY_CHECK_ERR_RET(stmt->kw == LY_STMT_ENUM, LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw),
                    lyplg_ext_stmt2str(stmt->kw)), LY_EVALID);
            LY_CHECK_RET(lysp_stmt_type_enum_value_pos(ctx, child, &enm->value, &enm->flags, &enm->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw, 0, &enm->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), lyplg_ext_stmt2str(stmt->kw));
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}